

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleTest::Clean
          (StorageMultisampleTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  uint local_1c;
  GLuint i;
  Functions *gl;
  StorageMultisampleTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    if (this->m_rbo[local_1c] != 0) {
      (**(code **)(lVar3 + 0x460))(1,this->m_rbo + local_1c);
      this->m_rbo[local_1c] = 0;
    }
    if (this->m_fbo[local_1c] != 0) {
      (**(code **)(lVar3 + 0x440))(1,this->m_fbo + local_1c);
      this->m_fbo[local_1c] = 0;
    }
  }
  (**(code **)(lVar3 + 0x1c0))(0,0,0);
  (**(code **)(lVar3 + 0x1c8))(0x3ff0000000000000);
  (**(code **)(lVar3 + 0x208))(0);
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void StorageMultisampleTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release objects. */
	for (glw::GLuint i = 0; i < 2; ++i)
	{
		if (m_rbo[i])
		{
			gl.deleteRenderbuffers(1, &m_rbo[i]);

			m_rbo[i] = 0;
		}

		if (m_fbo[i])
		{
			gl.deleteFramebuffers(1, &m_fbo[i]);

			m_fbo[i] = 0;
		}
	}

	/* Returning to default clear values. */
	gl.clearColor(0.f, 0.f, 0.f, 0.f);
	gl.clearDepth(1.f);
	gl.clearStencil(0);

	/* Errors clean up. */
	while (gl.getError())
		;
}